

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr_acl.c
# Opt level: O3

int netaddr_acl_copy(netaddr_acl *to,netaddr_acl *from)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  _Bool _Var4;
  undefined6 uVar5;
  netaddr *pnVar6;
  
  free(to->accept);
  free(to->reject);
  to->reject = (netaddr *)0x0;
  to->reject_count = 0;
  to->accept = (netaddr *)0x0;
  to->accept_count = 0;
  to->reject_first = false;
  to->accept_default = false;
  *(undefined6 *)&to->field_0x22 = 0;
  sVar2 = from->accept_count;
  pnVar6 = from->reject;
  sVar3 = from->reject_count;
  to->accept = from->accept;
  to->accept_count = sVar2;
  to->reject = pnVar6;
  to->reject_count = sVar3;
  _Var4 = from->accept_default;
  uVar5 = *(undefined6 *)&from->field_0x22;
  to->reject_first = from->reject_first;
  to->accept_default = _Var4;
  *(undefined6 *)&to->field_0x22 = uVar5;
  sVar1 = to->accept_count;
  if (sVar1 != 0) {
    pnVar6 = (netaddr *)calloc(sVar1,0x12);
    to->accept = pnVar6;
    if (pnVar6 == (netaddr *)0x0) {
      return -1;
    }
    memcpy(pnVar6,from->accept,sVar1 * 0x12);
  }
  sVar1 = to->reject_count;
  if (sVar1 != 0) {
    pnVar6 = (netaddr *)calloc(sVar1,0x12);
    to->reject = pnVar6;
    if (pnVar6 == (netaddr *)0x0) {
      return -1;
    }
    memcpy(pnVar6,from->reject,sVar1 * 0x12);
    return 0;
  }
  return 0;
}

Assistant:

int
netaddr_acl_copy(struct netaddr_acl *to, const struct netaddr_acl *from) {
  netaddr_acl_remove(to);
  memcpy(to, from, sizeof(*to));

  if (to->accept_count) {
    to->accept = calloc(to->accept_count, sizeof(struct netaddr));
    if (to->accept == NULL) {
      return -1;
    }
    memcpy(to->accept, from->accept, to->accept_count * sizeof(struct netaddr));
  }

  if (to->reject_count) {
    to->reject = calloc(to->reject_count, sizeof(struct netaddr));
    if (to->reject == NULL) {
      return -1;
    }
    memcpy(to->reject, from->reject, to->reject_count * sizeof(struct netaddr));
  }
  return 0;
}